

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O0

SpatialMotionVector * __thiscall
iDynTree::Position::changePointOf(Position *this,SpatialMotionVector *other)

{
  Stride<0,_0> *this_00;
  VectorFixSize<3U> *pVVar1;
  double *dataPtr;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *this_01;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *this_02;
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDX;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RSI;
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDI;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> resAngular;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> resLinear;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> otherAngular;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> otherLinear;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> thisPos;
  SpatialMotionVector *result;
  PointerArgType in_stack_ffffffffffffff08;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>
  *in_stack_ffffffffffffff10;
  SpatialVector<iDynTree::SpatialMotionVector> *this_03;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffffa0;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffffa8;
  
  this_03 = in_RDI;
  SpatialMotionVector::SpatialMotionVector((SpatialMotionVector *)0x6c361d);
  this_00 = (Stride<0,_0> *)VectorFixSize<3U>::data((VectorFixSize<3U> *)in_RSI);
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,this_00);
  pVVar1 = &SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(in_RDX)->super_Vector3;
  dataPtr = VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_ffffffffffffff10,dataPtr,this_00);
  pVVar1 = &SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(in_RDX)->super_Vector3;
  this_01 = (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
            VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (this_01,dataPtr,this_00);
  pVVar1 = &SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(this_03)->super_Vector3;
  VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_01,dataPtr,
             this_00);
  pVVar1 = &SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(this_03)->super_Vector3;
  this_02 = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
             *)VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_01,dataPtr,
             this_00);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  operator+(this_02,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_03);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_00,in_RSI);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_00,
             (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_RSI);
  return (SpatialMotionVector *)in_RDI;
}

Assistant:

SpatialMotionVector Position::changePointOf(const SpatialMotionVector & other) const
    {
        SpatialMotionVector result;

        Eigen::Map<const Eigen::Vector3d> thisPos(this->data());
        Eigen::Map<const Eigen::Vector3d> otherLinear(other.getLinearVec3().data());
        Eigen::Map<const Eigen::Vector3d> otherAngular(other.getAngularVec3().data());
        Eigen::Map<Eigen::Vector3d> resLinear(result.getLinearVec3().data());
        Eigen::Map<Eigen::Vector3d> resAngular(result.getAngularVec3().data());

        resLinear  = otherLinear + thisPos.cross(otherAngular);
        resAngular = otherAngular;

        return result;
    }